

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Writer.cpp
# Opt level: O0

void __thiscall adios2::core::engine::BP5Writer::Init(BP5Writer *this)

{
  int iVar1;
  long in_RDI;
  BP5Writer *in_stack_000000d0;
  BP5Writer *in_stack_00000150;
  BP5Writer *in_stack_00000320;
  
  *(long *)(in_RDI + 0x298) = in_RDI;
  iVar1 = helper::Comm::Rank((Comm *)0xa813b3);
  *(int *)(in_RDI + 0xc0) = iVar1;
  InitParameters(this);
  InitAggregator(in_stack_00000150);
  InitTransports(in_stack_00000320);
  InitBPBuffer(in_stack_000000d0);
  return;
}

Assistant:

void BP5Writer::Init()
{
    m_BP5Serializer.m_Engine = this;
    m_RankMPI = m_Comm.Rank();
    InitParameters();
    InitAggregator();
    InitTransports();
    InitBPBuffer();
}